

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int fdParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  int size;
  char *base;
  int local_44;
  char *local_40;
  char *local_38;
  
  local_40 = (char *)0x0;
  nb_tests = nb_tests + 1;
  local_38 = err;
  iVar1 = open64(filename,0);
  if (((uint)options >> 0x1e & 1) == 0) {
    uVar2 = xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(uVar2,testStructuredErrorHandler,0);
    lVar3 = xmlCtxtReadFd(uVar2,iVar1,filename,0,options);
    xmlFreeParserCtxt(uVar2);
  }
  else {
    uVar2 = htmlNewParserCtxt();
    xmlCtxtSetErrorHandler(uVar2,testStructuredErrorHandler,0);
    lVar3 = htmlCtxtReadFd(uVar2,iVar1,filename,0,options);
    htmlFreeParserCtxt(uVar2);
  }
  close(iVar1);
  if (result == (char *)0x0) {
    bVar4 = true;
  }
  else {
    if (lVar3 == 0) {
      local_40 = "";
      local_44 = 0;
    }
    else if (((uint)options >> 0x1e & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(lVar3,&local_40,&local_44);
    }
    iVar1 = compareFileMem(result,local_40,local_44);
    bVar4 = iVar1 == 0;
  }
  if (lVar3 != 0) {
    if (local_40 != (char *)0x0) {
      (*_xmlFree)();
    }
    xmlFreeDoc(lVar3);
  }
  if (bVar4) {
    if (local_38 == (char *)0x0) {
      if ((options & 0x10U) == 0) {
        return 0;
      }
      if (testErrorsSize == 0) {
        return 0;
      }
      fprintf(_stderr,"Validation for %s failed\n",filename);
      return 0;
    }
    iVar1 = compareFileMem(local_38,testErrors,testErrorsSize);
    if (iVar1 == 0) {
      return 0;
    }
    fprintf(_stderr,"Error for %s failed\n",filename);
  }
  else {
    fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
  }
  return -1;
}

Assistant:

static int
fdParseTest(const char *filename, const char *result, const char *err,
             int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base = NULL;
    int size, res = 0, fd;

    nb_tests++;
    fd = open(filename, RD_FLAGS);
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        ctxt = htmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
        doc = htmlCtxtReadFd(ctxt, fd, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
    } else
#endif
    {
        ctxt = xmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
	doc = xmlCtxtReadFd(ctxt, fd, filename, NULL, options);
        xmlFreeParserCtxt(ctxt);
    }
    close(fd);
    if (result) {
	if (doc == NULL) {
	    base = "";
	    size = 0;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML) {
		htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
	    } else
#endif
	    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
	}
	res = compareFileMem(result, base, size);
    }
    if (doc != NULL) {
	if (base != NULL)
	    xmlFree((char *)base);
	xmlFreeDoc(doc);
    }
    if (res != 0) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        return(-1);
    }
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    } else if (options & XML_PARSE_DTDVALID) {
        if (testErrorsSize != 0)
	    fprintf(stderr, "Validation for %s failed\n", filename);
    }

    return(0);
}